

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpconn.c
# Opt level: O3

void tcp_cancel(nni_aio *aio,void *arg,int rv)

{
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0xa8));
  iVar1 = nni_aio_list_active(aio);
  if (iVar1 != 0) {
    nni_aio_list_remove(aio);
    nni_aio_finish_error(aio,rv);
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0xa8));
  return;
}

Assistant:

static void
tcp_cancel(nni_aio *aio, void *arg, int rv)
{
	nni_tcp_conn *c = arg;

	nni_mtx_lock(&c->mtx);
	if (nni_aio_list_active(aio)) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, rv);
	}
	nni_mtx_unlock(&c->mtx);
}